

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable.hpp
# Opt level: O2

bool __thiscall
cs_impl::any::holder<std::shared_ptr<cs::context_type>_>::compare
          (holder<std::shared_ptr<cs::context_type>_> *this,baseHolder *obj)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  
  iVar2 = (*obj->_vptr_baseHolder[2])(obj);
  iVar3 = (*(this->super_baseHolder)._vptr_baseHolder[2])(this);
  bVar1 = std::type_info::operator==
                    ((type_info *)CONCAT44(extraout_var,iVar2),
                     (type_info *)CONCAT44(extraout_var_00,iVar3));
  if (bVar1) {
    bVar1 = (this->mDat).super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
            (element_type *)obj[1]._vptr_baseHolder;
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool compare(const baseHolder *obj) const override
			{
				if (obj->type() == this->type())
					return cs_impl::compare(mDat, static_cast<const holder<T> *>(obj)->data());
				else
					return false;
			}